

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordered_set.h
# Opt level: O0

bool __thiscall xla::OrderedSet<int>::Insert(OrderedSet<int> *this,int value)

{
  size_type sVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>,_bool> pVar2;
  int local_34;
  pair<const_int,_int> local_30;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_28;
  byte local_20;
  byte local_15;
  int local_14;
  bool new_insertion;
  OrderedSet<int> *pOStack_10;
  int value_local;
  OrderedSet<int> *this_local;
  
  local_14 = value;
  pOStack_10 = this;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->value_sequence_);
  local_34 = (int)sVar1;
  std::pair<const_int,_int>::pair<int_&,_int,_true>(&local_30,&local_14,&local_34);
  pVar2 = std::
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::insert(&this->value_to_index_,&local_30);
  local_28._M_cur =
       (__node_type *)pVar2.first.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur
  ;
  local_20 = pVar2.second;
  local_15 = local_20 & 1;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->value_sequence_,&local_14);
  }
  return (bool)(local_15 & 1);
}

Assistant:

bool Insert(T value) {
    bool new_insertion =
      value_to_index_.insert({value, static_cast<int32_t>(value_sequence_.size())}).second;
    if (new_insertion) {
      value_sequence_.push_back(value);
    }
    return new_insertion;
  }